

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game-event.c
# Opt level: O1

void event_remove_all_handlers(void)

{
  event_handler_entry *peVar1;
  event_handler_entry *p;
  long lVar2;
  
  lVar2 = 0;
  do {
    p = event_handlers[lVar2];
    while (p != (event_handler_entry *)0x0) {
      peVar1 = p->next;
      mem_free(p);
      p = peVar1;
    }
    event_handlers[lVar2] = (event_handler_entry *)0x0;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x42);
  return;
}

Assistant:

void event_remove_all_handlers(void)
{
	int type;
	struct event_handler_entry *handler, *next;

	for (type = 0; type < N_GAME_EVENTS; type++) {
		handler = event_handlers[type];
		while (handler) {
			next = handler->next;
			mem_free(handler);
			handler = next;
		}
		event_handlers[type] = NULL;
	}
}